

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3ExprGlobalHitsCb(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  u8 uVar1;
  undefined4 uVar2;
  Fts3Cursor *pCsr;
  sqlite3_vtab *psVar3;
  sqlite3_int64 sVar4;
  int iVar5;
  Fts3Expr *pExpr_00;
  u32 *puVar6;
  undefined4 *puVar7;
  Fts3Expr *pFVar8;
  long lVar9;
  long lVar10;
  Fts3Expr *pFVar11;
  bool bVar12;
  int local_60;
  u8 local_59;
  sqlite3_int64 local_58;
  sqlite3_int64 local_50;
  long local_48;
  Fts3Expr *local_40;
  long local_38;
  
  pCsr = *pCtx;
  local_38 = *(long *)((long)pCtx + 0x18);
  local_48 = (long)(iPhrase * *(int *)((long)pCtx + 8) * 3);
  psVar3 = (pCsr->base).pVtab;
  if ((pExpr->bDeferred != '\0') && (pExpr->pParent->eType != 1)) {
    if (*(int *)&psVar3[2].pModule < 1) {
      return 0;
    }
    uVar2 = (undefined4)pCsr->nDoc;
    puVar7 = (undefined4 *)(local_38 + local_48 * 4 + 8);
    lVar9 = 0;
    do {
      puVar7[-1] = uVar2;
      *puVar7 = uVar2;
      lVar9 = lVar9 + 1;
      puVar7 = puVar7 + 3;
    } while (lVar9 < *(int *)&psVar3[2].pModule);
    return 0;
  }
  local_60 = 0;
  if (pExpr->aMI == (u32 *)0x0) {
    local_58 = pCsr->iPrevId;
    pFVar11 = pExpr;
    do {
      pExpr_00 = pFVar11;
      pFVar11 = pExpr_00->pParent;
      if (pFVar11 == (Fts3Expr *)0x0) break;
    } while (pFVar11->eType == 1);
    local_50 = pExpr_00->iDocid;
    local_59 = pExpr_00->bEof;
    bVar12 = pExpr_00 == (Fts3Expr *)0x0;
    local_40 = pExpr;
    if (!bVar12) {
      bVar12 = false;
      pFVar11 = pExpr_00;
      do {
        pFVar8 = pFVar11;
        if (pFVar11->eType != 5) {
          pFVar8 = pFVar11->pRight;
        }
        puVar6 = (u32 *)sqlite3_malloc(*(int *)&psVar3[2].pModule * 0xc);
        pFVar8->aMI = puVar6;
        if (puVar6 == (u32 *)0x0) goto LAB_0018a88e;
        memset(puVar6,0,(long)*(int *)&psVar3[2].pModule * 0xc);
        pFVar11 = pFVar11->pLeft;
        bVar12 = pFVar11 == (Fts3Expr *)0x0;
      } while (!bVar12);
    }
    fts3EvalRestart(pCsr,pExpr_00,&local_60);
    sVar4 = local_50;
    if ((pCsr->isEof == '\0') && (local_60 == 0)) {
      do {
        do {
          if (pCsr->isRequireSeek == '\0') {
            sqlite3_reset(pCsr->pStmt);
          }
          fts3EvalNextRow(pCsr,pExpr_00,&local_60);
          uVar1 = pExpr_00->bEof;
          pCsr->isEof = uVar1;
          pCsr->isRequireSeek = '\x01';
          pCsr->isMatchinfoNeeded = 1;
          pCsr->iPrevId = pExpr_00->iDocid;
        } while (((uVar1 == '\0') && (pExpr_00->eType == 1)) &&
                (iVar5 = fts3EvalTestDeferredAndNear(pCsr,&local_60), iVar5 != 0));
        if ((local_60 == 0) && (pCsr->isEof == '\0')) {
          fts3EvalUpdateCounts(pExpr_00);
        }
      } while ((pCsr->isEof == '\0') && (local_60 == 0));
    }
    pCsr->isEof = '\0';
    pCsr->iPrevId = local_58;
    if (local_59 == '\0') {
      fts3EvalRestart(pCsr,pExpr_00,&local_60);
      do {
        fts3EvalNextRow(pCsr,pExpr_00,&local_60);
        if (pExpr_00->iDocid == sVar4) break;
      } while (local_60 == 0);
      fts3EvalTestDeferredAndNear(pCsr,&local_60);
    }
    else {
      pExpr_00->bEof = local_59;
    }
LAB_0018a88e:
    pExpr = local_40;
    iVar5 = 7;
    if (!bVar12) goto LAB_0018a8ac;
  }
  local_40 = pExpr;
  iVar5 = local_60;
LAB_0018a8ac:
  if (iVar5 != 0) {
    return iVar5;
  }
  if (*(int *)&psVar3[2].pModule < 1) {
    return 0;
  }
  local_38 = local_38 + local_48 * 4;
  puVar6 = local_40->aMI;
  lVar9 = 8;
  lVar10 = 0;
  do {
    *(undefined4 *)(local_38 + -4 + lVar9) = *(undefined4 *)((long)puVar6 + lVar9 + -4);
    *(undefined4 *)(local_38 + lVar9) = *(undefined4 *)((long)puVar6 + lVar9);
    lVar10 = lVar10 + 1;
    lVar9 = lVar9 + 0xc;
  } while (lVar10 < *(int *)&psVar3[2].pModule);
  return 0;
}

Assistant:

static int fts3ExprGlobalHitsCb(
  Fts3Expr *pExpr,                /* Phrase expression node */
  int iPhrase,                    /* Phrase number (numbered from zero) */
  void *pCtx                      /* Pointer to MatchInfo structure */
){
  MatchInfo *p = (MatchInfo *)pCtx;
  return sqlite3Fts3EvalPhraseStats(
      p->pCursor, pExpr, &p->aMatchinfo[3*iPhrase*p->nCol]
  );
}